

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O3

compile_errcode __thiscall
ArgumentList::Action
          (ArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  int iVar1;
  int line_number;
  int character_number;
  pointer pSVar2;
  LogTools *this_00;
  bool bVar3;
  SymbolName SVar4;
  iterator __position;
  SymbolName *pSVar5;
  undefined4 uVar6;
  string *name;
  SymbolTableTerm term;
  SymbolKind local_7c;
  string *local_78;
  SymbolName *local_70;
  SymbolTableTerm local_68;
  
  pSVar5 = &this->m_type;
  local_78 = &this->m_identifier_name;
  uVar6 = 0;
  local_70 = pSVar5;
  do {
    SVar4 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar6) {
    case 0:
      if (SVar4 == R_CIRCLE_BRACKET_SYM) {
        return 0;
      }
    case 3:
      if ((SVar4 & ~SWITCH_SYM) != INT_SYM) {
        return -1;
      }
      if (SVar4 == INT_SYM) {
        local_68.m_name._M_dataplus._M_p =
             (pointer)((ulong)local_68.m_name._M_dataplus._M_p._4_4_ << 0x20);
        __position._M_current =
             (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00132be3;
        *__position._M_current = INT;
LAB_00132bd9:
        (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      else {
        local_68.m_name._M_dataplus._M_p._0_4_ = 1;
        __position._M_current =
             (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (argument_type->super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = CHAR;
          goto LAB_00132bd9;
        }
LAB_00132be3:
        std::vector<_SymbolType,_std::allocator<_SymbolType>_>::_M_realloc_insert<_SymbolType>
                  (argument_type,__position,(_SymbolType *)&local_68);
      }
      *pSVar5 = SVar4;
      uVar6 = 1;
      break;
    case 1:
      if (SVar4 != IDENTIFIER_SYM) {
        return -1;
      }
      iVar1 = handle_correct_queue->m_current_locate;
      pSVar2 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      line_number = pSVar2[iVar1].m_line_number;
      character_number = pSVar2[iVar1].m_character_number;
      c0_compile::SymbolValue::GetValue<std::__cxx11::string>
                (&local_68.m_name,&pSVar2[iVar1].m_value);
      name = local_78;
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
        operator_delete(local_68.m_name._M_dataplus._M_p);
      }
      bVar3 = SymbolTableTree::FindTerm(symbol_table_tree,name,true);
      this_00 = g_log_tools;
      if (bVar3) {
        local_68.m_name._M_dataplus._M_p = (pointer)&local_68.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"repeat definition identifier(para)","");
        name = local_78;
        LogTools::SemanticErrorLogs(this_00,&local_68.m_name,local_78,line_number,character_number);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.m_name._M_dataplus._M_p != &local_68.m_name.field_2) {
          operator_delete(local_68.m_name._M_dataplus._M_p);
        }
      }
      pSVar5 = local_70;
      local_7c = PARAMETER;
      SymbolTableTerm::SymbolTableTerm(&local_68,name,&local_7c,local_70);
      SymbolTableTree::Insert(symbol_table_tree,&local_68);
      SymbolTableTerm::~SymbolTableTerm(&local_68);
      uVar6 = 2;
      break;
    case 2:
      uVar6 = 3;
      if (SVar4 != COMMA_SYM) {
        return 0;
      }
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        g_log_tools->SemanticErrorLogs(string("repeat definition identifier(para)"), m_identifier_name, line_number, character_number);
                    }
                    SymbolTableTerm term(m_identifier_name, PARAMETER, m_type);
                    symbol_table_tree->Insert(term);
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}